

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceBitfieldExtract_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType valueDataType,DataType offsetDataType,DataType bitsDataType
          )

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  allocator<char> local_28f;
  allocator<char> local_28e;
  allocator<char> local_28d;
  DataType local_28c;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  shaderType_00 = shaderType;
  local_28c = offsetDataType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&source,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1c8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"value",&local_28d);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_1e8,shaderType,&local_208);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"offset",&local_28e);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_228,valueDataType,&local_248);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"bits",&local_28f);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_268,local_28c,&local_288);
  poVar3 = std::operator<<(poVar3,(string *)&local_268);
  poVar3 = std::operator<<(poVar3,"    bitfieldExtract(value, offset, bits);\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceBitfieldExtract (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType valueDataType, glu::DataType offsetDataType, glu::DataType bitsDataType)
{
	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(valueDataType, "value")
			<< "    " << declareAndInitializeShaderVariable(offsetDataType, "offset")
			<< "    " << declareAndInitializeShaderVariable(bitsDataType, "bits")
			<< "    bitfieldExtract(value, offset, bits);\n"
			<< "}\n";

	return source.str();
}